

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_MD5.hh
# Opt level: O0

void __thiscall Pl_MD5::~Pl_MD5(Pl_MD5 *this)

{
  Pl_MD5 *this_local;
  
  ~Pl_MD5(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Pl_MD5() final = default;